

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

void on_bytes_encoded(void *context,uchar *bytes,size_t length,_Bool encode_complete)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  iVar1 = xio_send(*context,bytes,length,unchecked_on_send_complete,(void *)0x0);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"on_bytes_encoded",0x1fe,1,"xio_send failed");
    }
    handle_error((SASL_CLIENT_IO_INSTANCE *)context);
    return;
  }
  return;
}

Assistant:

static void on_bytes_encoded(void* context, const unsigned char* bytes, size_t length, bool encode_complete)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    (void)encode_complete;

    /* Codes_SRS_SASLCLIENTIO_01_120: [When SASL client IO is notified by `sasl_frame_codec` of bytes that have been encoded via the `on_bytes_encoded` callback and SASL client IO is in the state OPENING, SASL client IO shall send these bytes by using `xio_send`.]*/
    if (xio_send(sasl_client_io_instance->underlying_io, bytes, length, unchecked_on_send_complete, NULL) != 0)
    {
        /* Codes_SRS_SASLCLIENTIO_01_121: [If `xio_send` fails, the `on_io_error` callback shall be triggered.]*/
        LogError("xio_send failed");
        handle_error(sasl_client_io_instance);
    }
}